

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateSerializeOneExtensionRange
          (MessageGenerator *this,Printer *printer,ExtensionRange *range)

{
  string local_30;
  
  SimpleItoa_abi_cxx11_(&local_30,(protobuf *)(ulong)(uint)range->end,(int)range);
  io::Printer::Print(printer,"extensionWriter.writeUntil($end$, output);\n","end",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneExtensionRange(
    io::Printer* printer, const Descriptor::ExtensionRange* range) {
  printer->Print(
    "extensionWriter.writeUntil($end$, output);\n",
    "end", SimpleItoa(range->end));
}